

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerseusStationary.cpp
# Opt level: O2

void __thiscall PerseusStationary::SetValueFunction(PerseusStationary *this,string *filename)

{
  undefined1 *V;
  _func_int *p_Var1;
  long lVar2;
  size_t nrA;
  size_t nrS;
  PlanningUnitMADPDiscrete *this_00;
  ValueFunctionPOMDPDiscrete VStack_38;
  
  AlphaVectorPlanning::ImportValueFunction(&VStack_38,filename);
  V = &(this->super_Perseus).field_0x90;
  std::vector<AlphaVector,_std::allocator<AlphaVector>_>::_M_move_assign
            ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)V,&VStack_38);
  std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector(&VStack_38);
  p_Var1 = (this->super_Perseus)._vptr_Perseus[-3];
  lVar2 = *(long *)((long)&(this->super_Perseus)._m_verbose + (long)p_Var1);
  if (lVar2 == 0) {
    lVar2 = *(long *)((long)&(this->super_Perseus)._m_bestValue + (long)p_Var1);
  }
  nrA = (**(code **)(**(long **)(lVar2 + 0x30) + 0x68))();
  p_Var1 = (this->super_Perseus)._vptr_Perseus[-3];
  this_00 = *(PlanningUnitMADPDiscrete **)((long)&(this->super_Perseus)._m_verbose + (long)p_Var1);
  if (this_00 == (PlanningUnitMADPDiscrete *)0x0) {
    this_00 = *(PlanningUnitMADPDiscrete **)
               ((long)&(this->super_Perseus)._m_bestValue + (long)p_Var1);
  }
  nrS = PlanningUnitMADPDiscrete::GetNrStates(this_00);
  AlphaVectorPlanning::ValueFunctionToQ
            ((QFunctionsDiscrete *)&VStack_38,(ValueFunctionPOMDPDiscrete *)V,nrA,nrS);
  std::
  vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  ::_M_move_assign((vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                    *)&(this->super_Perseus).field_0xa8,&VStack_38);
  std::
  vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  ::~vector((vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
             *)&VStack_38);
  return;
}

Assistant:

void PerseusStationary::SetValueFunction(const string &filename)
{
    _m_valueFunction=ImportValueFunction(filename);
    _m_qFunction=AlphaVectorPlanning::
        ValueFunctionToQ(_m_valueFunction,
                         GetPU()->GetNrJointActions(),
                         GetPU()->GetNrStates());
}